

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_def.c
# Opt level: O1

_Bool upb_EnumDef_CheckNumber(upb_EnumDef *e,int32_t num)

{
  upb_MiniTableEnum *puVar1;
  uint32_t *puVar2;
  uint uVar3;
  uint uVar4;
  _Bool _Var5;
  
  puVar1 = e->layout;
  if ((uint)num < 0x40) {
    _Var5 = ((ulong)puVar1[1] >> ((ulong)(uint)num & 0x3f) & 1) != 0;
  }
  else {
    if (puVar1->mask_limit_dont_copy_me__upb_internal_use_only <= (uint)num) {
      uVar3 = puVar1->mask_limit_dont_copy_me__upb_internal_use_only >> 5;
      uVar4 = puVar1->value_count_dont_copy_me__upb_internal_use_only + uVar3;
      _Var5 = uVar3 < uVar4;
      if (_Var5) {
        puVar2 = &puVar1[1].mask_limit_dont_copy_me__upb_internal_use_only + uVar3;
        do {
          if (*puVar2 == num) {
            return true;
          }
          puVar2 = puVar2 + 1;
          _Var5 = puVar2 < &puVar1[1].mask_limit_dont_copy_me__upb_internal_use_only + uVar4;
        } while (_Var5);
      }
      return _Var5;
    }
    _Var5 = ((&puVar1[1].mask_limit_dont_copy_me__upb_internal_use_only)[(uint)num >> 5] >>
             (num & 0x1fU) & 1) != 0;
  }
  return _Var5;
}

Assistant:

bool upb_EnumDef_CheckNumber(const upb_EnumDef* e, int32_t num) {
  // We could use upb_EnumDef_FindValueByNumber(e, num) != NULL, but we expect
  // this to be faster (especially for small numbers).
  return upb_MiniTableEnum_CheckValue(e->layout, num);
}